

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int ARGBPolynomial(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,
                  float *poly,int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = -1;
  if (height != 0 &&
      ((0 < width && poly != (float *)0x0) &&
      (dst_argb != (uint8_t *)0x0 && src_argb != (uint8_t *)0x0))) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_argb = src_argb + ~height * src_stride_argb;
      src_stride_argb = -src_stride_argb;
    }
    if (width * 4 == dst_stride_argb && src_stride_argb == width * 4) {
      width = iVar1 * width;
      src_stride_argb = 0;
      dst_stride_argb = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    pcVar3 = ARGBPolynomialRow_C;
    if ((width & 1U) == 0) {
      pcVar3 = ARGBPolynomialRow_SSE2;
    }
    pcVar4 = ARGBPolynomialRow_C;
    if ((uVar2 & 0x20) != 0) {
      pcVar4 = pcVar3;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((uVar2 >> 10 & 1) != 0) {
      uVar2 = cpu_info_;
      if (cpu_info_ == 0) {
        uVar2 = InitCpuFlags();
      }
      pcVar3 = pcVar4;
      if ((width & 1U) == 0) {
        pcVar3 = ARGBPolynomialRow_AVX2;
      }
      if ((uVar2 & 0x1000) != 0) {
        pcVar4 = pcVar3;
      }
    }
    do {
      (*pcVar4)(src_argb,dst_argb,poly,width);
      src_argb = src_argb + src_stride_argb;
      dst_argb = dst_argb + dst_stride_argb;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBPolynomial(const uint8_t* src_argb,
                   int src_stride_argb,
                   uint8_t* dst_argb,
                   int dst_stride_argb,
                   const float* poly,
                   int width,
                   int height) {
  int y;
  void (*ARGBPolynomialRow)(const uint8_t* src_argb, uint8_t* dst_argb,
                            const float* poly, int width) = ARGBPolynomialRow_C;
  if (!src_argb || !dst_argb || !poly || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBPOLYNOMIALROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 2)) {
    ARGBPolynomialRow = ARGBPolynomialRow_SSE2;
  }
#endif
#if defined(HAS_ARGBPOLYNOMIALROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2) && TestCpuFlag(kCpuHasFMA3) &&
      IS_ALIGNED(width, 2)) {
    ARGBPolynomialRow = ARGBPolynomialRow_AVX2;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBPolynomialRow(src_argb, dst_argb, poly, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}